

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

float Log::logf(float __x)

{
  char in_AL;
  char *in_RSI;
  int in_EDI;
  float extraout_XMM0_Da;
  undefined1 local_e8 [48];
  float local_b8;
  undefined1 local_38 [8];
  va_list vl;
  char *format_local;
  int level_local;
  
  if (in_AL != '\0') {
    local_b8 = __x;
  }
  if (_Log::level <= in_EDI) {
    vl[0].overflow_arg_area = local_e8;
    vl[0]._0_8_ = &stack0x00000008;
    local_38._4_4_ = 0x30;
    local_38._0_4_ = 0x10;
    _Log::vlogf(in_EDI,in_RSI,(va_list *)local_38);
    __x = extraout_XMM0_Da;
  }
  return __x;
}

Assistant:

void Log::logf(int level, const char* format, ...)
{
  if(level < _Log::level)
    return;
  va_list vl;
  va_start(vl, format);
  _Log::vlogf(level, format, vl);
  va_end(vl);
}